

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  size_t size;
  void *dst_00;
  undefined4 uStack_64;
  SeqCollector seqCollector;
  void *dst;
  size_t dstCapacity;
  size_t srcSize_local;
  void *src_local;
  size_t outSeqsSize_local;
  ZSTD_Sequence *outSeqs_local;
  ZSTD_CCtx *zc_local;
  
  size = ZSTD_compressBound(srcSize);
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  dst_00 = ZSTD_customMalloc(size,customMem);
  if (dst_00 == (void *)0x0) {
    zc_local = (ZSTD_CCtx *)0xffffffffffffffc0;
  }
  else {
    *(ulong *)&zc->seqCollector = CONCAT44(uStack_64,1);
    (zc->seqCollector).seqStart = outSeqs;
    (zc->seqCollector).seqIndex = 0;
    (zc->seqCollector).maxSequences = outSeqsSize;
    ZSTD_compress2(zc,dst_00,size,src,srcSize);
    customMem_00.opaque = (void *)0x0;
    customMem_00.customAlloc = (ZSTD_allocFunction)0x0;
    customMem_00.customFree = (ZSTD_freeFunction)0x0;
    ZSTD_customFree(dst_00,customMem_00);
    zc_local = (ZSTD_CCtx *)(zc->seqCollector).seqIndex;
  }
  return (size_t)zc_local;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
    ZSTD_customFree(dst, ZSTD_defaultCMem);
    return zc->seqCollector.seqIndex;
}